

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,char *name,string *options
          ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *makefile_depends)

{
  ostream *poVar1;
  string responseFileNameFull;
  cmGeneratedFileStream responseStream;
  
  std::__cxx11::string::string
            ((string *)&responseFileNameFull,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::append((char *)&responseFileNameFull);
  std::__cxx11::string::append((char *)&responseFileNameFull);
  cmGeneratedFileStream::cmGeneratedFileStream
            (&responseStream,responseFileNameFull._M_dataplus._M_p,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&responseStream,true);
  poVar1 = std::operator<<((ostream *)&responseStream,(string *)options);
  std::operator<<(poVar1,"\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(makefile_depends,&responseFileNameFull);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->TargetBuildDirectory);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cmGeneratedFileStream::~cmGeneratedFileStream(&responseStream);
  std::__cxx11::string::~string((string *)&responseFileNameFull);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const char* name, std::string const& options,
  std::vector<std::string>& makefile_depends)
{
  // Create the response file.
  std::string responseFileNameFull = this->TargetBuildDirectoryFull;
  responseFileNameFull += "/";
  responseFileNameFull += name;
  cmGeneratedFileStream responseStream(responseFileNameFull.c_str());
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(responseFileNameFull);

  // Construct the name to be used on the command line.
  std::string responseFileName = this->TargetBuildDirectory;
  responseFileName += "/";
  responseFileName += name;
  return responseFileName;
}